

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBJ.cpp
# Opt level: O2

void __thiscall Iir::RBJ::IIRNotch::setupN(IIRNotch *this,double centerFrequency,double q_factor)

{
  double dVar1;
  double dVar2;
  
  dVar1 = cos(centerFrequency * 6.283185307179586);
  dVar2 = exp((centerFrequency * 6.283185307179586 * -0.5) / q_factor);
  Biquad::setCoefficients
            ((Biquad *)this,1.0,dVar2 * -2.0 * dVar1,dVar2 * dVar2,1.0,dVar1 * -2.0,1.0);
  return;
}

Assistant:

void IIRNotch::setupN (double centerFrequency,
			      double q_factor)
	{
		double w0 = 2 * doublePi * centerFrequency;
		double cs = cos (w0);
		double r = exp(-(w0/2) / q_factor);
		double b0 =  1;
		double b1 = -2 * cs;
		double b2 =  1;
		double a0 =  1;
		double a1 = -2 * r * cs;
		double a2 =  r * r;
		setCoefficients (a0, a1, a2, b0, b1, b2);
	}